

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_parser.c
# Opt level: O0

HT_ErrorCode print_help(int argc,char **argv,int pos)

{
  char *pcVar1;
  uint local_20;
  uint x;
  int pos_local;
  char **argv_local;
  int argc_local;
  
  printf("HawkTracer options:\n");
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    pcVar1 = "VALUE";
    if (arguments[local_20].is_flag != 0) {
      pcVar1 = "      ";
    }
    printf("  %s %s   %s\n",arguments[local_20].argument,pcVar1,arguments[local_20].help);
  }
  exit(0);
}

Assistant:

static HT_ErrorCode
print_help(int argc, char** argv, int pos)
{
    HT_UNUSED(argc);
    HT_UNUSED(argv);
    HT_UNUSED(pos);

    printf("HawkTracer options:\n");

    for (unsigned int x = 0; x < sizeof(arguments) / sizeof(arguments[0]); x++)
    {
        printf("  %s %s   %s\n",
            arguments[x].argument,
            arguments[x].is_flag ? "      " : "VALUE",
            arguments[x].help);
    }

    exit(0);

    return HT_ERR_OK;
}